

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx.h
# Opt level: O2

int gladLoadGLXUserPtr(Display *display,int screen,GLADuserptrloadfunc load,void *userptr)

{
  undefined8 uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int local_38;
  int major;
  
  sf_glad_glXQueryVersion = (PFNGLXQUERYVERSIONPROC)(*load)(userptr,"glXQueryVersion");
  if (sf_glad_glXQueryVersion == (PFNGLXQUERYVERSIONPROC)0x0) {
    return 0;
  }
  _local_38 = 0;
  if (display == (Display *)0x0) {
    iVar4 = 0;
    display = (Display *)XOpenDisplay(0);
    if (display == (Display *)0x0) {
      display = (Display *)0x0;
      goto LAB_001cd204;
    }
    uVar1 = XDefaultScreenOfDisplay(display);
    screen = XScreenNumberOfScreen(uVar1);
  }
  (*sf_glad_glXQueryVersion)(display,&major,&local_38);
  uVar2 = (uint)(1 < major);
  uVar3 = 1;
  SF_GLAD_GLX_VERSION_1_0 = uVar2;
  if (-1 < local_38) {
    SF_GLAD_GLX_VERSION_1_0 = uVar3;
  }
  SF_GLAD_GLX_VERSION_1_1 = uVar2;
  if (0 < local_38) {
    SF_GLAD_GLX_VERSION_1_1 = uVar3;
  }
  SF_GLAD_GLX_VERSION_1_2 = uVar2;
  if (1 < local_38) {
    SF_GLAD_GLX_VERSION_1_2 = uVar3;
  }
  SF_GLAD_GLX_VERSION_1_3 = uVar2;
  if (2 < local_38) {
    SF_GLAD_GLX_VERSION_1_3 = uVar3;
  }
  SF_GLAD_GLX_VERSION_1_4 = uVar2;
  if (3 < local_38) {
    SF_GLAD_GLX_VERSION_1_4 = uVar3;
  }
  if (major != 1) {
    SF_GLAD_GLX_VERSION_1_4 = uVar2;
    SF_GLAD_GLX_VERSION_1_3 = uVar2;
    SF_GLAD_GLX_VERSION_1_1 = uVar2;
    SF_GLAD_GLX_VERSION_1_0 = uVar2;
    SF_GLAD_GLX_VERSION_1_2 = uVar2;
  }
  iVar4 = major * 10000 + local_38;
LAB_001cd204:
  if (SF_GLAD_GLX_VERSION_1_0 != 0) {
    sf_glad_glXChooseVisual = (PFNGLXCHOOSEVISUALPROC)(*load)(userptr,"glXChooseVisual");
    sf_glad_glXCopyContext = (PFNGLXCOPYCONTEXTPROC)(*load)(userptr,"glXCopyContext");
    sf_glad_glXCreateContext = (PFNGLXCREATECONTEXTPROC)(*load)(userptr,"glXCreateContext");
    sf_glad_glXCreateGLXPixmap = (PFNGLXCREATEGLXPIXMAPPROC)(*load)(userptr,"glXCreateGLXPixmap");
    sf_glad_glXDestroyContext = (PFNGLXDESTROYCONTEXTPROC)(*load)(userptr,"glXDestroyContext");
    sf_glad_glXDestroyGLXPixmap = (PFNGLXDESTROYGLXPIXMAPPROC)(*load)(userptr,"glXDestroyGLXPixmap")
    ;
    sf_glad_glXGetConfig = (PFNGLXGETCONFIGPROC)(*load)(userptr,"glXGetConfig");
    sf_glad_glXGetCurrentContext =
         (PFNGLXGETCURRENTCONTEXTPROC)(*load)(userptr,"glXGetCurrentContext");
    sf_glad_glXGetCurrentDrawable =
         (PFNGLXGETCURRENTDRAWABLEPROC)(*load)(userptr,"glXGetCurrentDrawable");
    sf_glad_glXIsDirect = (PFNGLXISDIRECTPROC)(*load)(userptr,"glXIsDirect");
    sf_glad_glXMakeCurrent = (PFNGLXMAKECURRENTPROC)(*load)(userptr,"glXMakeCurrent");
    sf_glad_glXQueryExtension = (PFNGLXQUERYEXTENSIONPROC)(*load)(userptr,"glXQueryExtension");
    sf_glad_glXQueryVersion = (PFNGLXQUERYVERSIONPROC)(*load)(userptr,"glXQueryVersion");
    sf_glad_glXSwapBuffers = (PFNGLXSWAPBUFFERSPROC)(*load)(userptr,"glXSwapBuffers");
    sf_glad_glXUseXFont = (PFNGLXUSEXFONTPROC)(*load)(userptr,"glXUseXFont");
    sf_glad_glXWaitGL = (*load)(userptr,"glXWaitGL");
    sf_glad_glXWaitX = (*load)(userptr,"glXWaitX");
  }
  if (SF_GLAD_GLX_VERSION_1_1 != 0) {
    sf_glad_glXGetClientString = (PFNGLXGETCLIENTSTRINGPROC)(*load)(userptr,"glXGetClientString");
    sf_glad_glXQueryExtensionsString =
         (PFNGLXQUERYEXTENSIONSSTRINGPROC)(*load)(userptr,"glXQueryExtensionsString");
    sf_glad_glXQueryServerString =
         (PFNGLXQUERYSERVERSTRINGPROC)(*load)(userptr,"glXQueryServerString");
  }
  if (SF_GLAD_GLX_VERSION_1_2 != 0) {
    sf_glad_glXGetCurrentDisplay =
         (PFNGLXGETCURRENTDISPLAYPROC)(*load)(userptr,"glXGetCurrentDisplay");
  }
  if (SF_GLAD_GLX_VERSION_1_3 != 0) {
    sf_glad_glXChooseFBConfig = (PFNGLXCHOOSEFBCONFIGPROC)(*load)(userptr,"glXChooseFBConfig");
    sf_glad_glXCreateNewContext = (PFNGLXCREATENEWCONTEXTPROC)(*load)(userptr,"glXCreateNewContext")
    ;
    sf_glad_glXCreatePbuffer = (PFNGLXCREATEPBUFFERPROC)(*load)(userptr,"glXCreatePbuffer");
    sf_glad_glXCreatePixmap = (PFNGLXCREATEPIXMAPPROC)(*load)(userptr,"glXCreatePixmap");
    sf_glad_glXCreateWindow = (PFNGLXCREATEWINDOWPROC)(*load)(userptr,"glXCreateWindow");
    sf_glad_glXDestroyPbuffer = (PFNGLXDESTROYPBUFFERPROC)(*load)(userptr,"glXDestroyPbuffer");
    sf_glad_glXDestroyPixmap = (PFNGLXDESTROYPIXMAPPROC)(*load)(userptr,"glXDestroyPixmap");
    sf_glad_glXDestroyWindow = (PFNGLXDESTROYWINDOWPROC)(*load)(userptr,"glXDestroyWindow");
    sf_glad_glXGetCurrentReadDrawable =
         (PFNGLXGETCURRENTREADDRAWABLEPROC)(*load)(userptr,"glXGetCurrentReadDrawable");
    sf_glad_glXGetFBConfigAttrib =
         (PFNGLXGETFBCONFIGATTRIBPROC)(*load)(userptr,"glXGetFBConfigAttrib");
    sf_glad_glXGetFBConfigs = (PFNGLXGETFBCONFIGSPROC)(*load)(userptr,"glXGetFBConfigs");
    sf_glad_glXGetSelectedEvent = (PFNGLXGETSELECTEDEVENTPROC)(*load)(userptr,"glXGetSelectedEvent")
    ;
    sf_glad_glXGetVisualFromFBConfig =
         (PFNGLXGETVISUALFROMFBCONFIGPROC)(*load)(userptr,"glXGetVisualFromFBConfig");
    sf_glad_glXMakeContextCurrent =
         (PFNGLXMAKECONTEXTCURRENTPROC)(*load)(userptr,"glXMakeContextCurrent");
    sf_glad_glXQueryContext = (PFNGLXQUERYCONTEXTPROC)(*load)(userptr,"glXQueryContext");
    sf_glad_glXQueryDrawable = (PFNGLXQUERYDRAWABLEPROC)(*load)(userptr,"glXQueryDrawable");
    sf_glad_glXSelectEvent = (PFNGLXSELECTEVENTPROC)(*load)(userptr,"glXSelectEvent");
  }
  if (SF_GLAD_GLX_VERSION_1_4 != 0) {
    sf_glad_glXGetProcAddress = (PFNGLXGETPROCADDRESSPROC)(*load)(userptr,"glXGetProcAddress");
  }
  SF_GLAD_GLX_ARB_create_context = glad_glx_has_extension(display,screen,"GLX_ARB_create_context");
  SF_GLAD_GLX_ARB_create_context_profile =
       glad_glx_has_extension(display,screen,"GLX_ARB_create_context_profile");
  SF_GLAD_GLX_ARB_framebuffer_sRGB =
       glad_glx_has_extension(display,screen,"GLX_ARB_framebuffer_sRGB");
  SF_GLAD_GLX_ARB_multisample = glad_glx_has_extension(display,screen,"GLX_ARB_multisample");
  SF_GLAD_GLX_EXT_framebuffer_sRGB =
       glad_glx_has_extension(display,screen,"GLX_EXT_framebuffer_sRGB");
  SF_GLAD_GLX_EXT_swap_control = glad_glx_has_extension(display,screen,"GLX_EXT_swap_control");
  SF_GLAD_GLX_MESA_swap_control = glad_glx_has_extension(display,screen,"GLX_MESA_swap_control");
  SF_GLAD_GLX_SGIX_pbuffer = glad_glx_has_extension(display,screen,"GLX_SGIX_pbuffer");
  SF_GLAD_GLX_SGI_swap_control = glad_glx_has_extension(display,screen,"GLX_SGI_swap_control");
  if (SF_GLAD_GLX_ARB_create_context != 0) {
    sf_glad_glXCreateContextAttribsARB =
         (PFNGLXCREATECONTEXTATTRIBSARBPROC)(*load)(userptr,"glXCreateContextAttribsARB");
  }
  if (SF_GLAD_GLX_EXT_swap_control != 0) {
    sf_glad_glXSwapIntervalEXT = (PFNGLXSWAPINTERVALEXTPROC)(*load)(userptr,"glXSwapIntervalEXT");
  }
  if (SF_GLAD_GLX_MESA_swap_control != 0) {
    sf_glad_glXGetSwapIntervalMESA =
         (PFNGLXGETSWAPINTERVALMESAPROC)(*load)(userptr,"glXGetSwapIntervalMESA");
    sf_glad_glXSwapIntervalMESA = (PFNGLXSWAPINTERVALMESAPROC)(*load)(userptr,"glXSwapIntervalMESA")
    ;
  }
  if (SF_GLAD_GLX_SGIX_pbuffer != 0) {
    sf_glad_glXCreateGLXPbufferSGIX =
         (PFNGLXCREATEGLXPBUFFERSGIXPROC)(*load)(userptr,"glXCreateGLXPbufferSGIX");
    sf_glad_glXDestroyGLXPbufferSGIX =
         (PFNGLXDESTROYGLXPBUFFERSGIXPROC)(*load)(userptr,"glXDestroyGLXPbufferSGIX");
    sf_glad_glXGetSelectedEventSGIX =
         (PFNGLXGETSELECTEDEVENTSGIXPROC)(*load)(userptr,"glXGetSelectedEventSGIX");
    sf_glad_glXQueryGLXPbufferSGIX =
         (PFNGLXQUERYGLXPBUFFERSGIXPROC)(*load)(userptr,"glXQueryGLXPbufferSGIX");
    sf_glad_glXSelectEventSGIX = (PFNGLXSELECTEVENTSGIXPROC)(*load)(userptr,"glXSelectEventSGIX");
  }
  if (SF_GLAD_GLX_SGI_swap_control != 0) {
    sf_glad_glXSwapIntervalSGI = (PFNGLXSWAPINTERVALSGIPROC)(*load)(userptr,"glXSwapIntervalSGI");
  }
  return iVar4;
}

Assistant:

static int gladLoadGLXUserPtr(Display *display, int screen, GLADuserptrloadfunc load, void *userptr) {
    int version;
    glXQueryVersion = (PFNGLXQUERYVERSIONPROC) load(userptr, "glXQueryVersion");
    if(glXQueryVersion == NULL) return 0;
    version = glad_glx_find_core_glx(&display, &screen);

    glad_glx_load_GLX_VERSION_1_0(load, userptr);
    glad_glx_load_GLX_VERSION_1_1(load, userptr);
    glad_glx_load_GLX_VERSION_1_2(load, userptr);
    glad_glx_load_GLX_VERSION_1_3(load, userptr);
    glad_glx_load_GLX_VERSION_1_4(load, userptr);

    if (!glad_glx_find_extensions(display, screen)) return 0;
    glad_glx_load_GLX_ARB_create_context(load, userptr);
    glad_glx_load_GLX_EXT_swap_control(load, userptr);
    glad_glx_load_GLX_MESA_swap_control(load, userptr);
    glad_glx_load_GLX_SGIX_pbuffer(load, userptr);
    glad_glx_load_GLX_SGI_swap_control(load, userptr);

    return version;
}